

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::PolyKernel::PolyKernel(PolyKernel *this,PolyKernel *from)

{
  void *pvVar1;
  double dVar2;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__PolyKernel_00707b08;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->degree_ = from->degree_;
  dVar2 = from->gamma_;
  this->c_ = from->c_;
  this->gamma_ = dVar2;
  return;
}

Assistant:

PolyKernel::PolyKernel(const PolyKernel& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&c_, &from.c_,
    reinterpret_cast<char*>(&degree_) -
    reinterpret_cast<char*>(&c_) + sizeof(degree_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.PolyKernel)
}